

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

string * spdlog::details::os::filename_to_str(filename_t *filename)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE std::string filename_to_str(const filename_t &filename)
{
    return filename;
}